

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O2

void __thiscall
xmrig::Threads<xmrig::CudaThreads>::toJSON
          (Threads<xmrig::CudaThreads> *this,Value *out,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  bool bVar1;
  Document *doc_00;
  undefined1 auStack_48 [24];
  undefined4 local_30;
  
  allocator = doc->allocator_;
  bVar1 = has(this);
  if (bVar1) {
    doc_00 = (Document *)get(this);
    auStack_48._16_8_ = "cn/blur";
    local_30 = 7;
    CudaThreads::toJSON((CudaThreads *)auStack_48,doc_00);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(out,(StringRefType *)(auStack_48 + 0x10),
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)auStack_48,allocator);
  }
  return;
}

Assistant:

void xmrig::Threads<T>::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    if (has())
    {
        auto &ct = get();
        out.AddMember("cn/blur", ct.toJSON(doc), allocator);
    }   
}